

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int get8_packet_raw(vorb *f)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  if ((f->bytes_in_seg != '\0') ||
     ((uVar3 = 0xffffffff, f->last_seg == 0 && (iVar2 = next_segment(f), iVar2 != 0)))) {
    f->bytes_in_seg = f->bytes_in_seg + 0xff;
    f->packet_bytes = f->packet_bytes + 1;
    bVar1 = get8(f);
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

static int get8_packet_raw(vorb *f)
{
   if (!f->bytes_in_seg) {  // CLANG!
      if (f->last_seg) return EOP;
      else if (!next_segment(f)) return EOP;
   }
   assert(f->bytes_in_seg > 0);
   --f->bytes_in_seg;
   ++f->packet_bytes;
   return get8(f);
}